

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yyDo(GREG *G,yyaction action,int begin,int end,char *name)

{
  yythunk *pyVar1;
  char *name_local;
  int end_local;
  int begin_local;
  yyaction action_local;
  GREG *G_local;
  
  while (G->thunkslen <= G->thunkpos) {
    G->thunkslen = G->thunkslen << 1;
    pyVar1 = (yythunk *)realloc(G->thunks,(long)G->thunkslen << 5);
    G->thunks = pyVar1;
  }
  G->thunks[G->thunkpos].begin = begin;
  G->thunks[G->thunkpos].end = end;
  G->thunks[G->thunkpos].action = action;
  G->thunks[G->thunkpos].name = name;
  G->thunkpos = G->thunkpos + 1;
  return;
}

Assistant:

YY_LOCAL(void) yyDo(GREG *G, yyaction action, int begin, int end, const char *name)
{
  while (G->thunkpos >= G->thunkslen)
    {
      G->thunkslen *= 2;
      G->thunks= (yythunk*)YY_REALLOC(G->thunks, sizeof(yythunk) * G->thunkslen, G->data);
    }
  G->thunks[G->thunkpos].begin=  begin;
  G->thunks[G->thunkpos].end=    end;
  G->thunks[G->thunkpos].action= action;
  G->thunks[G->thunkpos].name= name;
  ++G->thunkpos;
}